

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.h
# Opt level: O2

int __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapeCube>::ClassId
          (TPZCompElKernelHDiv3D<pzshape::TPZShapeCube> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZCompElKernelHDiv3D",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZCompElHCurl<pzshape::TPZShapeCube>::ClassId
                    (&this->super_TPZCompElHCurl<pzshape::TPZShapeCube>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZCompElKernelHDiv3D<TSHAPE>::ClassId() const{
    return Hash("TPZCompElKernelHDiv3D") ^ TPZCompElHCurl<TSHAPE>::ClassId() << 1;
}